

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_draw.cpp
# Opt level: O2

void V_DrawBorder(int x1,int y1,int x2,int y2)

{
  DFrameBuffer *pDVar1;
  FTextureID texnum;
  FTexture *pFVar2;
  FString name;
  
  if ((level.info == (level_info_t *)0x0) ||
     (name.Chars = ((level.info)->BorderTexture).Chars, *(int *)(name.Chars + -0xc) == 0)) {
    name.Chars = gameinfo.BorderFlat.Chars;
  }
  texnum = FTextureManager::CheckForTexture(&TexMan,name.Chars,2,1);
  pDVar1 = screen;
  if (texnum.texnum < 1) {
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
              (screen,(ulong)(uint)x1,(ulong)(uint)y1,(ulong)(uint)x2,(ulong)(uint)y2,0,0);
  }
  else {
    pFVar2 = FTextureManager::operator()(&TexMan,texnum,false);
    (*(pDVar1->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xf])
              (pDVar1,(ulong)(uint)x1,(ulong)(uint)y1,(ulong)(uint)x2,(ulong)(uint)y2,pFVar2,0);
  }
  return;
}

Assistant:

void V_DrawBorder (int x1, int y1, int x2, int y2)
{
	FTextureID picnum;

	if (level.info != NULL && level.info->BorderTexture.Len() != 0)
	{
		picnum = TexMan.CheckForTexture (level.info->BorderTexture, FTexture::TEX_Flat);
	}
	else
	{
		picnum = TexMan.CheckForTexture (gameinfo.BorderFlat, FTexture::TEX_Flat);
	}

	if (picnum.isValid())
	{
		screen->FlatFill (x1, y1, x2, y2, TexMan(picnum));
	}
	else
	{
		screen->Clear (x1, y1, x2, y2, 0, 0);
	}
}